

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O2

EvaluationResult __thiscall
chatra::TemporaryObject::evaluateAsPackageInitCall(TemporaryObject *this)

{
  pointer pFVar1;
  size_t sVar2;
  Method *refMethod;
  MethodTable *this_00;
  _Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_48;
  
  pFVar1 = (this->thread->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar2 = ((long)(this->thread->frames).
                 super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pFVar1) / 0x110 - 1;
  while( true ) {
    if (sVar2 == 0xffffffffffffffff) {
      return Failed;
    }
    if ((pFVar1[sVar2].scope)->type == Package) break;
    sVar2 = pFVar1[sVar2].parentIndex;
  }
  this_00 = (MethodTable *)
            ((long)((pFVar1[sVar2].package)->clPackage)._M_t.
                   super___uniq_ptr_impl<chatra::Class,_std::default_delete<chatra::Class>_>._M_t +
            0x268);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  refMethod = MethodTable::find(this_00,(Class *)0x0,this->name,Invalid,&this->args,
                                (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                                 *)&local_48);
  std::_Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::~_Vector_base
            (&local_48);
  if (refMethod == (Method *)0x0) {
    return Failed;
  }
  if (refMethod->position != 0xffffffffffffffff) {
    return Failed;
  }
  if ((refMethod->super_MethodBase).node == (Node *)0x0) {
    return Failed;
  }
  setFrameMethod(this,0xffffffffffffffff,pFVar1[sVar2].package,this_00,refMethod,(Method *)0x0,
                 this->hasArgs);
  resolveNativeMethod(this,this->name,Invalid);
  return Succeeded;
}

Assistant:

TemporaryObject::EvaluationResult TemporaryObject::evaluateAsPackageInitCall() {
	chatra_assert(requiresEvaluate());
	chatra_assert(!hasRef());
	chatra_assert(type == Type::Empty && hasName && name == StringId::Init && !hasArgs);

	size_t frameIndex = thread.frames.size() - 1;
	while (frameIndex != SIZE_MAX) {
		auto& f = thread.frames[frameIndex];
		if (f.scope->getScopeType() != ScopeType::Package) {
			frameIndex = f.parentIndex;
			continue;
		}

		auto& table = f.package.clPackage->refConstructors();
		auto* refMethod = table.find(nullptr, name, StringId::Invalid, args, {});
		if (refMethod == nullptr || refMethod->position != SIZE_MAX || refMethod->node == nullptr)
			return EvaluationResult::Failed;

		setFrameMethod(SIZE_MAX, &f.package, &table, refMethod, nullptr, hasArgs);
		resolveNativeMethod(name, StringId::Invalid);
		return EvaluationResult::Succeeded;
	}

	return EvaluationResult::Failed;
}